

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

bool dgrminer::is_pattern_edge_smaller_than
               (array<int,_10UL> *pattern_edge1,array<int,_10UL> *pattern_edge2,bool ignore_edge_id)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  const_reference pvVar6;
  bool local_3c;
  bool local_3a;
  int local_38;
  int k;
  int j2;
  int i2;
  int j1;
  int i1;
  bool result;
  int max_index;
  bool ignore_edge_id_local;
  array<int,_10UL> *pattern_edge2_local;
  array<int,_10UL> *pattern_edge1_local;
  
  iVar5 = 10;
  if (ignore_edge_id) {
    iVar5 = 9;
  }
  pvVar6 = std::array<int,_10UL>::operator[](pattern_edge1,0);
  iVar1 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](pattern_edge1,1);
  iVar2 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](pattern_edge2,0);
  iVar3 = *pvVar6;
  pvVar6 = std::array<int,_10UL>::operator[](pattern_edge2,1);
  iVar4 = *pvVar6;
  if (iVar1 < iVar2) {
    if (iVar3 < iVar4) {
      local_3c = true;
      if (iVar4 <= iVar2) {
        local_3a = iVar3 < iVar1 && iVar2 == iVar4;
        local_3c = local_3a;
      }
    }
    else {
      local_3c = iVar2 <= iVar3;
    }
  }
  else if (iVar3 < iVar4) {
    local_3c = iVar1 < iVar4;
  }
  else {
    local_3c = true;
    if (iVar3 <= iVar1) {
      local_3c = iVar1 == iVar3 && iVar2 < iVar4;
    }
  }
  if (((!local_3c) && (iVar1 == iVar3)) && (iVar2 == iVar4)) {
    for (local_38 = 2; local_38 < iVar5; local_38 = local_38 + 1) {
      pvVar6 = std::array<int,_10UL>::operator[](pattern_edge1,(long)local_38);
      iVar1 = *pvVar6;
      pvVar6 = std::array<int,_10UL>::operator[](pattern_edge2,(long)local_38);
      if (iVar1 < *pvVar6) {
        return true;
      }
      pvVar6 = std::array<int,_10UL>::operator[](pattern_edge1,(long)local_38);
      iVar1 = *pvVar6;
      pvVar6 = std::array<int,_10UL>::operator[](pattern_edge2,(long)local_38);
      if (*pvVar6 < iVar1) {
        return local_3c;
      }
    }
  }
  return local_3c;
}

Assistant:

bool
    is_pattern_edge_smaller_than(const std::array<int, 10> &pattern_edge1, const std::array<int, 10> &pattern_edge2,
                                 bool ignore_edge_id)
    {
        int max_index = (ignore_edge_id) ? 9 : 10;
        bool result = false;
        int i1 = pattern_edge1[0];
        int j1 = pattern_edge1[1];
        int i2 = pattern_edge2[0];
        int j2 = pattern_edge2[1];
        if (i1 < j1) // edge1 is forward
        {
            if (i2 < j2) // edge2 is forward
            {
                result = (j1 < j2) || (i1 > i2 && j1 == j2);
            }
            else // edge2 is backward
            {

                result = j1 <= i2;
            }
        }
        else // edge1 is backward
        {
            if (i2 < j2) // edge2 is forward
            {
                result = i1 < j2;
            }
            else // edge2 is backward
            {
                result = (i1 < i2) || (i1 == i2 && j1 < j2);
            }
        }
        if (!result && i1 == i2 && j1 == j2)
        {
            // check also edge ID (the 10th element)
            for (int k = 2; k < max_index; k++)
            {
                if (pattern_edge1[k] < pattern_edge2[k])
                {
                    result = true;
                    break;
                }
                else if (pattern_edge1[k] > pattern_edge2[k])
                {
                    break;
                }
            }
        }
        return result;
    }